

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3.h
# Opt level: O0

void ncnn::conv3x3s1_winograd23_transform_kernel_sse
               (Mat *kernel,Mat *kernel_tm,int inch,int outch,Option *opt)

{
  float *pfVar1;
  int in_ECX;
  long lVar2;
  int in_EDX;
  Mat *in_RDI;
  int i_1;
  float *tmpp;
  int j;
  int i;
  float tmp [4] [3];
  float *k2;
  float *k1;
  float *k0;
  float *kernel_tm0;
  float *kernel0;
  int q;
  int p;
  float ktm [4] [3];
  Allocator *in_stack_fffffffffffffec0;
  Mat *this;
  size_t in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffed4;
  int iVar3;
  undefined8 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  int iVar4;
  int in_stack_fffffffffffffee4;
  Mat *in_stack_fffffffffffffee8;
  float afStack_110 [12];
  float *local_e0;
  float *local_d8;
  float *local_d0;
  Mat local_b8;
  float *local_70;
  float *local_68;
  int local_60;
  int local_5c;
  float local_58 [16];
  int local_18;
  int local_14;
  Mat *local_8;
  
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_8 = in_RDI;
  Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
              (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),(int)in_stack_fffffffffffffed8,
              in_stack_fffffffffffffed4,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  memcpy(local_58,&DAT_00958980,0x30);
  for (local_5c = 0; local_5c < local_18; local_5c = local_5c + 1) {
    for (local_60 = 0; local_60 < local_14; local_60 = local_60 + 1) {
      local_68 = Mat::operator_cast_to_float_(local_8);
      local_68 = local_68 + (long)(local_5c * local_14 * 9) + (long)(local_60 * 9);
      this = &local_b8;
      Mat::channel(in_stack_fffffffffffffee8,in_stack_fffffffffffffee4);
      pfVar1 = Mat::row(this,local_60);
      Mat::~Mat((Mat *)0x2b732a);
      local_d0 = local_68;
      local_d8 = local_68 + 3;
      local_e0 = local_68 + 6;
      local_70 = pfVar1;
      for (in_stack_fffffffffffffee4 = 0; in_stack_fffffffffffffee4 < 4;
          in_stack_fffffffffffffee4 = in_stack_fffffffffffffee4 + 1) {
        afStack_110[(long)in_stack_fffffffffffffee4 * 3 + -2] =
             *local_d0 * local_58[(long)in_stack_fffffffffffffee4 * 3] +
             local_d0[1] * local_58[(long)in_stack_fffffffffffffee4 * 3 + 1] +
             local_d0[2] * local_58[(long)in_stack_fffffffffffffee4 * 3 + 2];
        afStack_110[(long)in_stack_fffffffffffffee4 * 3 + -1] =
             *local_d8 * local_58[(long)in_stack_fffffffffffffee4 * 3] +
             local_d8[1] * local_58[(long)in_stack_fffffffffffffee4 * 3 + 1] +
             local_d8[2] * local_58[(long)in_stack_fffffffffffffee4 * 3 + 2];
        afStack_110[(long)in_stack_fffffffffffffee4 * 3] =
             *local_e0 * local_58[(long)in_stack_fffffffffffffee4 * 3] +
             local_e0[1] * local_58[(long)in_stack_fffffffffffffee4 * 3 + 1] +
             local_e0[2] * local_58[(long)in_stack_fffffffffffffee4 * 3 + 2];
      }
      for (iVar4 = 0; iVar4 < 4; iVar4 = iVar4 + 1) {
        lVar2 = (long)iVar4;
        for (iVar3 = 0; iVar3 < 4; iVar3 = iVar3 + 1) {
          local_70[iVar4 * 4 + iVar3] =
               afStack_110[lVar2 * 3 + -2] * local_58[(long)iVar3 * 3] +
               afStack_110[lVar2 * 3 + -1] * local_58[(long)iVar3 * 3 + 1] +
               afStack_110[lVar2 * 3] * local_58[(long)iVar3 * 3 + 2];
        }
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd23_transform_kernel_sse(const Mat& kernel, Mat& kernel_tm, int inch, int outch, const Option& opt)
{
    kernel_tm.create(4 * 4, inch, outch);

    // G
    const float ktm[4][3] = {
        {1.0f, 0.0f, 0.0f},
        {1.0f / 2, 1.0f / 2, 1.0f / 2},
        {1.0f / 2, -1.0f / 2, 1.0f / 2},
        {0.0f, 0.0f, 1.0f}
    };

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        for (int q = 0; q < inch; q++)
        {
            const float* kernel0 = (const float*)kernel + p * inch * 9 + q * 9;
            float* kernel_tm0 = kernel_tm.channel(p).row(q);

            // transform kernel
            const float* k0 = kernel0;
            const float* k1 = kernel0 + 3;
            const float* k2 = kernel0 + 6;

            // h
            float tmp[4][3];
            for (int i = 0; i < 4; i++)
            {
                tmp[i][0] = k0[0] * ktm[i][0] + k0[1] * ktm[i][1] + k0[2] * ktm[i][2];
                tmp[i][1] = k1[0] * ktm[i][0] + k1[1] * ktm[i][1] + k1[2] * ktm[i][2];
                tmp[i][2] = k2[0] * ktm[i][0] + k2[1] * ktm[i][1] + k2[2] * ktm[i][2];
            }

            // U
            for (int j = 0; j < 4; j++)
            {
                float* tmpp = &tmp[j][0];

                for (int i = 0; i < 4; i++)
                {
                    kernel_tm0[j * 4 + i] = tmpp[0] * ktm[i][0] + tmpp[1] * ktm[i][1] + tmpp[2] * ktm[i][2];
                }
            }
        }
    }
}